

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON_bool parse_value(cJSON *item,parse_buffer *input_buffer)

{
  ulong uVar1;
  byte bVar2;
  uchar *puVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  int iVar7;
  cJSON_bool cVar8;
  lconv *plVar9;
  long lVar10;
  byte bVar11;
  uint uVar12;
  long in_FS_OFFSET;
  double dVar13;
  uchar *after_end;
  byte *local_80;
  byte local_78 [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar8 = 0;
  if ((input_buffer != (parse_buffer *)0x0) &&
     (puVar3 = input_buffer->content, puVar3 != (uchar *)0x0)) {
    uVar4 = input_buffer->length;
    uVar5 = input_buffer->offset;
    uVar1 = uVar5 + 4;
    if ((uVar4 < uVar1) || (iVar7 = strncmp((char *)(puVar3 + uVar5),"null",4), iVar7 != 0)) {
      if ((uVar4 < uVar5 + 5) || (iVar7 = strncmp((char *)(puVar3 + uVar5),"false",5), iVar7 != 0))
      {
        if ((uVar4 < uVar1) || (iVar7 = strncmp((char *)(puVar3 + uVar5),"true",4), iVar7 != 0)) {
          if (uVar5 < uVar4) {
            if (puVar3[uVar5] == '\"') {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                cVar8 = parse_string(item,input_buffer);
                return cVar8;
              }
              goto LAB_00102842;
            }
            if (uVar5 < uVar4) {
              if (puVar3[uVar5] == '-' || (byte)(puVar3[uVar5] - 0x30) < 10) {
                local_80 = (byte *)0x0;
                plVar9 = localeconv();
                puVar3 = input_buffer->content;
                if (puVar3 != (uchar *)0x0) {
                  bVar2 = *plVar9->decimal_point;
                  uVar1 = input_buffer->length;
                  sVar6 = input_buffer->offset;
                  lVar10 = 0;
                  do {
                    if ((uVar1 <= sVar6 + lVar10) ||
                       ((bVar11 = puVar3[lVar10 + sVar6], 9 < bVar11 - 0x30 &&
                        ((uVar12 = bVar11 - 0x2b, 0x3a < uVar12 ||
                         (((0x400000004000005U >> ((ulong)uVar12 & 0x3f) & 1) == 0 &&
                          (bVar11 = bVar2, (ulong)uVar12 != 3)))))))) goto LAB_0010277a;
                    local_78[lVar10] = bVar11;
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 0x3f);
                  lVar10 = 0x3f;
LAB_0010277a:
                  local_78[lVar10] = 0;
                  dVar13 = strtod((char *)local_78,(char **)&local_80);
                  if (local_78 != local_80) {
                    item->valuedouble = dVar13;
                    iVar7 = 0x7fffffff;
                    if ((dVar13 < 2147483647.0) && (iVar7 = -0x80000000, -2147483648.0 < dVar13)) {
                      iVar7 = (int)dVar13;
                    }
                    item->valueint = iVar7;
                    item->type = 8;
                    input_buffer->offset =
                         (size_t)(local_80 + (input_buffer->offset - (long)local_78));
                    goto LAB_00102729;
                  }
                }
              }
              else if (uVar5 < uVar4) {
                if (puVar3[uVar5] == '[') {
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                    cVar8 = parse_array(item,input_buffer);
                    return cVar8;
                  }
                  goto LAB_00102842;
                }
                if (uVar5 < uVar4) {
                  cVar8 = 0;
                  if (puVar3[uVar5] == '{') {
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      cVar8 = parse_object(item,input_buffer);
                      return cVar8;
                    }
                    goto LAB_00102842;
                  }
                  goto LAB_00102823;
                }
              }
            }
          }
          cVar8 = 0;
          goto LAB_00102823;
        }
        item->type = 2;
        item->valueint = 1;
        goto LAB_00102725;
      }
      item->type = 1;
      input_buffer->offset = uVar5 + 5;
    }
    else {
      item->type = 4;
LAB_00102725:
      input_buffer->offset = uVar1;
    }
LAB_00102729:
    cVar8 = 1;
  }
LAB_00102823:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return cVar8;
  }
LAB_00102842:
  __stack_chk_fail();
}

Assistant:

static cJSON_bool parse_value(cJSON * const item, parse_buffer * const input_buffer)
{
    if ((input_buffer == NULL) || (input_buffer->content == NULL))
    {
        return false; /* no input */
    }

    /* parse the different types of values */
    /* null */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "null", 4) == 0))
    {
        item->type = cJSON_NULL;
        input_buffer->offset += 4;
        return true;
    }
    /* false */
    if (can_read(input_buffer, 5) && (strncmp((const char*)buffer_at_offset(input_buffer), "false", 5) == 0))
    {
        item->type = cJSON_False;
        input_buffer->offset += 5;
        return true;
    }
    /* true */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "true", 4) == 0))
    {
        item->type = cJSON_True;
        item->valueint = 1;
        input_buffer->offset += 4;
        return true;
    }
    /* string */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '\"'))
    {
        return parse_string(item, input_buffer);
    }
    /* number */
    if (can_access_at_index(input_buffer, 0) && ((buffer_at_offset(input_buffer)[0] == '-') || ((buffer_at_offset(input_buffer)[0] >= '0') && (buffer_at_offset(input_buffer)[0] <= '9'))))
    {
        return parse_number(item, input_buffer);
    }
    /* array */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '['))
    {
        return parse_array(item, input_buffer);
    }
    /* object */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '{'))
    {
        return parse_object(item, input_buffer);
    }


    return false;
}